

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O1

void __thiscall level_mesh::create_models(level_mesh *this)

{
  float fVar1;
  float fVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer ppbVar7;
  b_model_instance *pbVar8;
  pointer p_Var9;
  pointer p_Var10;
  pointer p_Var11;
  pointer p_Var12;
  size_t sVar13;
  pointer ppbVar14;
  b_submesh_vec submeshes;
  b_submesh_vec fake_submeshes;
  b_submesh_vec mu_submeshes;
  b_submesh_vec local_88;
  b_submesh_vec local_68;
  b_submesh_vec local_48;
  
  pbVar3 = (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar4 = (this->m_mu_instances).super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar6 = (this->m_mu_instances).super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>.
           _M_impl.super__Vector_impl_data._M_start;
  xray_re::msg("building edge-connected submeshes");
  local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar13 = create_submeshes(this,&local_48,&local_68,&local_88);
  xray_re::msg("submeshes (MU): %Iu",
               (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  xray_re::msg("submeshes (fake): %Iu",
               (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  xray_re::msg("submeshes (regular): %Iu",
               (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  xray_re::msg("reordering faces");
  reorder_faces(this);
  xray_re::msg("accounting submeshes");
  account_submeshes(this,&local_48,&local_68,&local_88);
  xray_re::msg("creating collision models (MU)");
  setup_collision_models(this,&local_48);
  xray_re::msg("creating collision models (fake)");
  setup_collision_models(this,&local_68);
  merge_mu_fake_submeshes(this,&local_48,&local_68,&local_88);
  xray_re::msg("creating collision models (regular)");
  setup_collision_models(this,&local_88);
  merge_regular_submeshes(this,&local_88,sVar13 + ((long)pbVar3 - (long)pbVar5 >> 4));
  if (this->m_debug_merge == true) {
    ppbVar7 = (this->m_instances).
              super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppbVar14 = (this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppbVar14 != ppbVar7;
        ppbVar14 = ppbVar14 + 1) {
      pbVar8 = *ppbVar14;
      fVar1 = this->m_glue_factor;
      fVar2 = (pbVar8->aabb).field_0.field_1.y1;
      (pbVar8->aabb).field_0.field_1.x1 = (pbVar8->aabb).field_0.field_1.x1 - fVar1;
      (pbVar8->aabb).field_0.field_1.y1 = fVar2 - fVar1;
      (pbVar8->aabb).field_0.field_1.z1 = (pbVar8->aabb).field_0.field_1.z1 - fVar1;
      (pbVar8->aabb).field_0.field_1.x2 = (pbVar8->aabb).field_0.field_1.x2 + fVar1;
      (pbVar8->aabb).field_0.field_1.y2 = (pbVar8->aabb).field_0.field_1.y2 + fVar1;
      (pbVar8->aabb).field_0.field_1.z2 = fVar1 + (pbVar8->aabb).field_0.field_1.z2;
    }
    p_Var10 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var11 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    p_Var9 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
             super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->super_xr_mesh_builder).super_xr_mesh.m_points.
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->m_fat_points).
         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    p_Var12 = (this->m_fat_points).
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->super_xr_mesh_builder).super_xr_mesh.m_points.
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (this->m_fat_points).
         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->super_xr_mesh_builder).super_xr_mesh.m_points.
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = p_Var12;
    (this->m_fat_points).
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = p_Var10;
    (this->m_fat_points).
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = p_Var11;
    (this->m_fat_points).
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = p_Var9;
  }
  p_Var9 = (this->m_fat_points).
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var10 = (this->m_fat_points).
            super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (p_Var9 != (pointer)0x0) {
    operator_delete(p_Var9,(long)p_Var10 - (long)p_Var9);
  }
  validate_instances_order(this);
  pre_commit(this);
  collect_mu_models(this,((long)pbVar4 - (long)pbVar6 >> 2) * -0xf0f0f0f0f0f0f0f);
  lock_models(this);
  if (local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void level_mesh::create_models()
{
	size_t num_models_hint = m_models.size(), num_mu_instances = m_mu_instances.size();

	msg("building edge-connected submeshes");
	b_submesh_vec mu_submeshes, fake_submeshes, submeshes;
	num_models_hint += create_submeshes(mu_submeshes, fake_submeshes, submeshes);
	msg("submeshes (MU): %" PRIuSIZET, mu_submeshes.size());
	msg("submeshes (fake): %" PRIuSIZET, fake_submeshes.size());
	msg("submeshes (regular): %" PRIuSIZET, submeshes.size());

	msg("reordering faces");
	reorder_faces();

	msg("accounting submeshes");
	account_submeshes(mu_submeshes, fake_submeshes, submeshes);

#ifdef USE_WIN32_MT
	HANDLE setup_thread = NULL;
	if (m_use_mt) {
		msg("creating collision models (regular) - starting thread");
		setup_thread_param param;
		param.__this = this;
		param.submeshes = &submeshes;
		setup_thread = (HANDLE)_beginthreadex(NULL, 0, &level_mesh::setup_thread_cb, &param, 0, NULL);
		xr_assert(setup_thread != NULL);
	}
#endif
	msg("creating collision models (MU)");
	setup_collision_models(mu_submeshes);
	msg("creating collision models (fake)");
	setup_collision_models(fake_submeshes);

#ifdef USE_WIN32_MT
	if (setup_thread != NULL) {
		b_submesh_vec temp_submeshes;
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, temp_submeshes);
		msg("creating collision models (regular) - waiting thread");
		WaitForSingleObject(setup_thread, INFINITE);
		submeshes.insert(submeshes.end(), temp_submeshes.begin(), temp_submeshes.end());
	} else
#endif
	{
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, submeshes);
		msg("creating collision models (regular)");
		setup_collision_models(submeshes);
	}
	merge_regular_submeshes(submeshes, num_models_hint);

	if (m_debug_merge) {
		for (b_model_instance_vec_it it = m_instances.begin(),
				end = m_instances.end(); it != end; ++it) {
			(*it)->aabb.grow(m_glue_factor);
		}
		m_points.swap(m_fat_points);
	}
	std::vector<fvector3>().swap(m_fat_points);

	validate_instances_order();

	pre_commit();

	collect_mu_models(num_mu_instances);

	lock_models();
}